

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

bool tinyexr::CompressPiz
               (uchar *outPtr,uint *outSize,uchar *inPtr,size_t inSize,
               vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *channelInfo,
               int data_width,int num_lines)

{
  long *plVar1;
  unsigned_short *h;
  size_t __n;
  ushort uVar2;
  ushort uVar3;
  unsigned_short uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  reference pvVar8;
  unsigned_short *puVar9;
  int iVar10;
  ushort uVar11;
  pointer pPVar12;
  long lVar13;
  short sVar14;
  long lVar15;
  int iVar16;
  int *piVar17;
  uint uVar18;
  unsigned_short *puVar19;
  long lVar20;
  pointer pPVar21;
  ushort *puVar22;
  ushort *puVar23;
  long lVar24;
  size_t i;
  ulong uVar25;
  int *piVar26;
  int iVar27;
  bool bVar28;
  uint uStack_22120;
  unsigned_short maxNonZero;
  unsigned_short minNonZero;
  uint uStack_22118;
  uint uStack_22114;
  unsigned_short *puStack_22110;
  int iStack_22108;
  uint uStack_22104;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  int iStack_220e8;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> channelData;
  uchar bitmap [8192];
  unsigned_short lut [65536];
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&tmpBuffer,inSize >> 1,(allocator_type *)lut);
  std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
            (&channelData,
             ((long)(channelInfo->
                    super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>)
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(channelInfo->
                   super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x30,(allocator_type *)lut);
  pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
  lVar15 = (long)channelData.
                 super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)channelData.
                 super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  piVar17 = &((channelInfo->
              super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>).
              _M_impl.super__Vector_impl_data._M_start)->pixel_type;
  piVar26 = &(channelData.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start)->size;
  while (bVar28 = lVar15 != 0, lVar15 = lVar15 + -1, bVar28) {
    ((PIZChannelData *)(piVar26 + -7))->start = pvVar8;
    *(reference *)(piVar26 + -5) = pvVar8;
    piVar26[-3] = data_width;
    piVar26[-2] = num_lines;
    iVar7 = *piVar17;
    *piVar26 = (iVar7 != 1) + 1;
    pvVar8 = pvVar8 + (num_lines * data_width << (iVar7 != 1));
    piVar17 = piVar17 + 0xc;
    piVar26 = piVar26 + 8;
  }
  puVar9 = (unsigned_short *)0x0;
  pPVar12 = channelData.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pPVar21 = channelData.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar19 = (unsigned_short *)(ulong)(uint)num_lines;
  if (num_lines < 1) {
    puVar19 = puVar9;
  }
  while ((int)puVar9 != (int)puVar19) {
    lVar15 = 8;
    puStack_22110 = puVar9;
    for (uVar25 = 0; uVar25 < (ulong)((long)pPVar12 - (long)pPVar21 >> 5); uVar25 = uVar25 + 1) {
      lVar24 = (long)*(int *)((long)&pPVar21->ny + lVar15) *
               (long)*(int *)((long)&pPVar21->end + lVar15);
      __n = lVar24 * 2;
      memcpy(*(void **)((long)&pPVar21->start + lVar15),inPtr,__n);
      inPtr = inPtr + lVar24 * 2;
      plVar1 = (long *)((long)&pPVar21->start + lVar15);
      *plVar1 = *plVar1 + __n;
      lVar15 = lVar15 + 0x20;
      pPVar12 = channelData.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pPVar21 = channelData.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    puVar9 = (unsigned_short *)(ulong)((int)puStack_22110 + 1);
  }
  pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
  bitmapFromData(pvVar8,(int)((ulong)((long)tmpBuffer.
                                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)tmpBuffer.
                                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 1),bitmap,
                 &minNonZero,&maxNonZero);
  uVar4 = forwardLutFromBitmap(bitmap,lut);
  pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
  applyLut(lut,pvVar8,
           (int)((ulong)((long)tmpBuffer.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)tmpBuffer.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 1));
  *(unsigned_short *)outPtr = minNonZero;
  *(unsigned_short *)(outPtr + 2) = maxNonZero;
  piVar26 = (int *)(outPtr + 4);
  if (minNonZero <= maxNonZero) {
    lVar15 = (ulong)maxNonZero - (ulong)minNonZero;
    memcpy(piVar26,bitmap + minNonZero,lVar15 + 1);
    piVar26 = (int *)((long)piVar26 + lVar15 + 1);
  }
  for (uVar25 = 0;
      uVar25 < (ulong)((long)channelData.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)channelData.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar25 = uVar25 + 1) {
    pPVar12 = channelData.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start + uVar25;
    lVar15 = 0;
    for (lVar24 = 0; iVar7 = pPVar12->size, lVar24 < iVar7; lVar24 = lVar24 + 1) {
      puVar19 = pPVar12->start;
      uStack_22114 = pPVar12->nx;
      uStack_22118 = pPVar12->ny;
      iStack_22108 = uStack_22114 * iVar7;
      uStack_22104 = uStack_22118;
      if ((int)uStack_22114 < (int)uStack_22118) {
        uStack_22104 = uStack_22114;
      }
      uStack_22120 = 1;
      for (uVar5 = 2; (int)uVar5 <= (int)uStack_22104; uVar5 = uVar5 * 2) {
        iVar6 = (uStack_22118 - uVar5) * iStack_22108;
        iVar10 = uVar5 * iStack_22108;
        iVar16 = (uStack_22114 - uVar5) * iVar7;
        lVar13 = (long)(int)(uStack_22120 * iVar7);
        lVar20 = (long)(int)(uStack_22120 * iStack_22108);
        for (puVar23 = (ushort *)((long)puVar19 + lVar15); puVar23 <= puVar19 + lVar24 + iVar6;
            puVar23 = puVar23 + iVar10) {
          for (puVar22 = puVar23; puVar22 <= puVar23 + iVar16;
              puVar22 = puVar22 + (int)(uVar5 * iVar7)) {
            puStack_22110 = puVar22 + lVar13;
            puVar9 = puVar22 + lVar20;
            h = puVar22 + lVar13 + lVar20;
            uVar2 = *puVar22;
            uVar3 = puVar22[lVar13];
            if (uVar4 < 0x4000) {
              sVar14 = *puVar9 - *h;
              uVar18 = (int)(short)*h + (int)(short)*puVar9;
              *puVar22 = (unsigned_short)
                         ((uint)(((int)uVar18 >> 1) + ((int)(short)uVar3 + (int)(short)uVar2 >> 1))
                         >> 1);
              *puVar9 = (short)((uint)((int)(short)uVar3 + (int)(short)uVar2) >> 1) -
                        (short)(uVar18 >> 1);
              *puStack_22110 =
                   (unsigned_short)((uint)((int)sVar14 + (int)(short)(uVar2 - uVar3)) >> 1);
              *h = (uVar2 - uVar3) - sVar14;
            }
            else {
              uVar18 = (uVar2 ^ 0x8000) - (uint)uVar3 & 0x8000ffff;
              iVar27 = (*puVar9 ^ 0x8000) - (uint)*h;
              wenc16((ushort)(uVar18 >> 0x10) ^ (ushort)((uVar2 ^ 0x8000) + (uint)uVar3 >> 1),
                     (ushort)((uint)iVar27 >> 0x10) & 0x8000 ^
                     (ushort)((*puVar9 ^ 0x8000) + (uint)*h >> 1),puVar22,puVar9);
              wenc16((unsigned_short)uVar18,(unsigned_short)iVar27,puStack_22110,h);
            }
          }
          if ((uStack_22114 & uStack_22120) != 0) {
            uVar2 = *puVar22;
            uVar3 = puVar22[lVar20];
            if (uVar4 < 0x4000) {
              uVar11 = (ushort)((uint)((int)(short)uVar3 + (int)(short)uVar2) >> 1);
              iVar27 = (int)(short)uVar2 - (int)(short)uVar3;
            }
            else {
              iVar27 = (uVar2 ^ 0x8000) - (uint)uVar3;
              uVar11 = (ushort)((uint)iVar27 >> 0x10) & 0x8000 ^
                       (ushort)((uVar2 ^ 0x8000) + (uint)uVar3 >> 1);
            }
            puVar22[lVar20] = (unsigned_short)iVar27;
            *puVar22 = uVar11;
          }
        }
        if ((uStack_22118 & uStack_22120) != 0) {
          puVar22 = puVar23 + iVar16;
          for (; puVar23 <= puVar22; puVar23 = puVar23 + (int)(uVar5 * iVar7)) {
            uVar2 = *puVar23;
            uVar3 = puVar23[lVar13];
            if (uVar4 < 0x4000) {
              uVar11 = (ushort)((uint)((int)(short)uVar3 + (int)(short)uVar2) >> 1);
              iVar6 = (int)(short)uVar2 - (int)(short)uVar3;
            }
            else {
              iVar6 = (uVar2 ^ 0x8000) - (uint)uVar3;
              uVar11 = (ushort)((uint)iVar6 >> 0x10) & 0x8000 ^
                       (ushort)((uVar2 ^ 0x8000) + (uint)uVar3 >> 1);
            }
            puVar23[lVar13] = (ushort)iVar6;
            *puVar23 = uVar11;
          }
        }
        uStack_22120 = uVar5;
      }
      lVar15 = lVar15 + 2;
    }
  }
  *piVar26 = 0;
  pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
  iVar7 = hufCompress(pvVar8,(int)((ulong)((long)tmpBuffer.
                                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)tmpBuffer.
                                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 1),
                      (char *)(piVar26 + 1));
  *piVar26 = iVar7;
  iStack_220e8 = (int)outPtr;
  *outSize = ((int)(piVar26 + 1) - iStack_220e8) + iVar7;
  std::_Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
  ~_Vector_base(&channelData.
                 super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
               );
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&tmpBuffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  return true;
}

Assistant:

bool CompressPiz(unsigned char *outPtr, unsigned int &outSize,
                 const unsigned char *inPtr, size_t inSize,
                 const std::vector<ChannelInfo> &channelInfo, int data_width,
                 int num_lines) {
  unsigned char bitmap[BITMAP_SIZE];
  unsigned short minNonZero;
  unsigned short maxNonZero;

#if !MINIZ_LITTLE_ENDIAN
  // @todo { PIZ compression on BigEndian architecture. }
  assert(0);
  return false;
#endif

  // Assume `inSize` is multiple of 2 or 4.
  std::vector<unsigned short> tmpBuffer(inSize / sizeof(unsigned short));

  std::vector<PIZChannelData> channelData(channelInfo.size());
  unsigned short *tmpBufferEnd = &tmpBuffer.at(0);

  for (size_t c = 0; c < channelData.size(); c++) {
    PIZChannelData &cd = channelData[c];

    cd.start = tmpBufferEnd;
    cd.end = cd.start;

    cd.nx = data_width;
    cd.ny = num_lines;
    // cd.ys = c.channel().ySampling;

    int pixelSize = sizeof(int);  // UINT and FLOAT
    if (channelInfo[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      pixelSize = sizeof(short);
    }

    cd.size = pixelSize / sizeof(short);

    tmpBufferEnd += cd.nx * cd.ny * cd.size;
  }

  const unsigned char *ptr = inPtr;
  for (int y = 0; y < num_lines; ++y) {
    for (size_t i = 0; i < channelData.size(); ++i) {
      PIZChannelData &cd = channelData[i];

      // if (modp (y, cd.ys) != 0)
      //    continue;

      int n = cd.nx * cd.size;
      memcpy(cd.end, ptr, n * sizeof(unsigned short));
      ptr += n * sizeof(unsigned short);
      cd.end += n;
    }
  }

  bitmapFromData(&tmpBuffer.at(0), tmpBuffer.size(), bitmap, minNonZero,
                 maxNonZero);

  unsigned short lut[USHORT_RANGE];
  unsigned short maxValue = forwardLutFromBitmap(bitmap, lut);
  applyLut(lut, &tmpBuffer.at(0), tmpBuffer.size());

  //
  // Store range compression info in _outBuffer
  //

  char *buf = reinterpret_cast<char *>(outPtr);

  memcpy(buf, &minNonZero, sizeof(unsigned short));
  buf += sizeof(unsigned short);
  memcpy(buf, &maxNonZero, sizeof(unsigned short));
  buf += sizeof(unsigned short);

  if (minNonZero <= maxNonZero) {
    memcpy(buf, (char *)&bitmap[0] + minNonZero, maxNonZero - minNonZero + 1);
    buf += maxNonZero - minNonZero + 1;
  }

  //
  // Apply wavelet encoding
  //

  for (size_t i = 0; i < channelData.size(); ++i) {
    PIZChannelData &cd = channelData[i];

    for (int j = 0; j < cd.size; ++j) {
      wav2Encode(cd.start + j, cd.nx, cd.size, cd.ny, cd.nx * cd.size,
                 maxValue);
    }
  }

  //
  // Apply Huffman encoding; append the result to _outBuffer
  //

  // length header(4byte), then huff data. Initialize length header with zero,
  // then later fill it by `length`.
  char *lengthPtr = buf;
  int zero = 0;
  memcpy(buf, &zero, sizeof(int));
  buf += sizeof(int);

  int length = hufCompress(&tmpBuffer.at(0), tmpBuffer.size(), buf);
  memcpy(lengthPtr, &length, sizeof(int));

  outSize = (reinterpret_cast<unsigned char *>(buf) - outPtr) + length;
  return true;
}